

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::visitStore(OptimizeInstructions *this,Store *curr)

{
  byte bVar1;
  Id IVar2;
  uint uVar3;
  Expression *pEVar4;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id != 1) {
    optimizeMemoryAccess(this,&curr->ptr,&curr->offset,(Name)(curr->memory).super_IString.str);
    optimizeStoredValue(this,&curr->value,(uint)curr->bytes);
    pEVar4 = curr->value;
    if (pEVar4->_id == UnaryId) {
      IVar2 = pEVar4[1]._id;
      if (IVar2 == AtomicRMWId) {
        (curr->valueType).id = 3;
        pEVar4 = (Expression *)pEVar4[1].type.id;
      }
      else {
        if (curr->isAtomic != false) {
          return;
        }
        if (TableSetId < IVar2) {
          return;
        }
        if ((0x600600000000U >> ((ulong)IVar2 & 0x3f) & 1) == 0) {
          return;
        }
        bVar1 = curr->bytes;
        uVar3 = wasm::Type::getByteSize(&curr->valueType);
        if (uVar3 != bVar1) {
          return;
        }
        pEVar4 = (Expression *)pEVar4[1].type.id;
        (curr->valueType).id = (pEVar4->type).id;
      }
      curr->value = pEVar4;
    }
  }
  return;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }